

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

hts_itr_t * cram_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  int iVar1;
  hts_itr_t *__ptr;
  cram_range r;
  
  __ptr = (hts_itr_t *)calloc(1,0x50);
  if (__ptr != (hts_itr_t *)0x0) {
    *(undefined4 *)__ptr = 1;
    __ptr->readrec = readrec;
    if (tid < 0) {
      if (tid == -4) {
        return __ptr;
      }
      if (tid == -5) {
        *(undefined4 *)__ptr = 3;
        return __ptr;
      }
      fprintf(_stderr,"[cram_itr_query] tid=%d not implemented for CRAM files -- Exiting\n",tid);
      abort();
    }
    iVar1 = cram_set_option(*(cram_fd **)&idx->n_lvls,CRAM_OPT_RANGE);
    if (iVar1 == 0) {
      __ptr->tid = tid;
      __ptr->beg = beg;
      __ptr->end = end;
      return __ptr;
    }
    free(__ptr);
  }
  return (hts_itr_t *)0x0;
}

Assistant:

static hts_itr_t *cram_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    const hts_cram_idx_t *cidx = (const hts_cram_idx_t *) idx;
    hts_itr_t *iter = (hts_itr_t *) calloc(1, sizeof(hts_itr_t));
    if (iter == NULL) return NULL;

    // Cons up a dummy iterator for which hts_itr_next() will simply invoke
    // the readrec function:
    iter->read_rest = 1;
    iter->off = NULL;
    iter->bins.a = NULL;
    iter->readrec = readrec;

    if (tid >= 0) {
        cram_range r = { tid, beg+1, end };
        if (cram_set_option(cidx->cram, CRAM_OPT_RANGE, &r) != 0) { free(iter); return NULL; }
        iter->curr_off = 0;
        // The following fields are not required by hts_itr_next(), but are
        // filled in in case user code wants to look at them.
        iter->tid = tid;
        iter->beg = beg;
        iter->end = end;
    }
    else switch (tid) {
    case HTS_IDX_REST:
        iter->curr_off = 0;
        break;
    case HTS_IDX_NONE:
        iter->curr_off = 0;
        iter->finished = 1;
        break;
    default:
        fprintf(stderr, "[cram_itr_query] tid=%d not implemented for CRAM files -- Exiting\n", tid);
        abort();
        break;
    }

    return iter;
}